

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedUsageOperators::Run(AdvancedUsageOperators *this)

{
  bool bVar1;
  GLuint GVar2;
  uint local_c8;
  uint local_c4;
  int i_1;
  int data_3 [1];
  int ref_data_1 [1];
  int i;
  int data_2 [4];
  int ref_data [2];
  int data_1 [1];
  int data [4];
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_vs;
  AdvancedUsageOperators *this_local;
  
  glsl_vs = (char *)this;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  if (bVar1) {
    local_20 = 
    "\nlayout(std430, binding = 0) buffer Buffer0 {\n  readonly int g_i0;\n  int g_o0;\n};\nlayout(std430, binding = 1) buffer Buffer1 {\n  int i0;\n} g_buffer1;\nuniform int g_values[] = int[](1, 2, 3, 4, 5, 6);\nvoid main() {\n  g_o0 += g_i0;\n  g_o0 <<= 1;\n  g_o0 = g_i0 > g_o0 ? g_i0 : g_o0;\n  g_o0 *= g_i0;\n  g_o0 = --g_o0 + g_values[g_i0];\n  g_o0++;\n  ++g_o0;\n  g_buffer1.i0 = 0xff2f;\n  g_o0 &= g_buffer1.i0;\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "\nlayout(std430, binding = 0) buffer Buffer0 {\n  readonly int g_i0;\n  int g_o0;\n};\nlayout(std430, binding = 1) buffer Buffer1 {\n  int i0;\n} g_buffer1;\nuniform int g_values[] = int[](1, 2, 3, 4, 5, 6);\nvoid main() {\n  g_o0 += g_i0;\n  g_o0 <<= 1;\n  g_o0 = g_i0 > g_o0 ? g_i0 : g_o0;\n  g_o0 *= g_i0;\n  g_o0 = --g_o0 + g_values[g_i0];\n  g_o0++;\n  ++g_o0;\n  g_buffer1.i0 = 0xff2f;\n  g_o0 &= g_buffer1.i0;\n}"
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_40,&local_78);
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar1) {
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,2,this->m_storage_buffer);
      stack0xffffffffffffff68 = 0x500000003;
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,ref_data + 1,0x88ea);
      memset(ref_data,0,4);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,4,ref_data,0x88ea);
      glu::CallLogWrapper::glEnable
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8c89);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,1);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      stack0xffffffffffffff5c = 0x2500000003;
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,0x10,ref_data_1);
      for (data_3[0] = 0; data_3[0] < 2; data_3[0] = data_3[0] + 1) {
        if (ref_data_1[data_3[0]] != data_2[(long)data_3[0] + 3]) {
          anon_unknown_0::Output
                    ("[Buffer0] Data at index %d is %d should be %d.\n",(ulong)(uint)data_3[0],
                     (ulong)(uint)ref_data_1[data_3[0]],(ulong)(uint)data_2[(long)data_3[0] + 3]);
          return (long)&DAT_ffffffffffffffff;
        }
      }
      i_1 = 0xff2f;
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glGetBufferSubData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0,4,&local_c4);
      for (local_c8 = 0; (int)local_c8 < 1; local_c8 = local_c8 + 1) {
        if ((&local_c4)[(int)local_c8] != data_3[(long)(int)local_c8 + -1]) {
          anon_unknown_0::Output
                    ("[Buffer1] Data at index %d is %d should be %d.\n",(ulong)local_c8,
                     (ulong)(&local_c4)[(int)local_c8],(ulong)(uint)data_3[(long)(int)local_c8 + -1]
                    );
          return (long)&DAT_ffffffffffffffff;
        }
      }
      this_local = (AdvancedUsageOperators *)0x0;
    }
    else {
      this_local = (AdvancedUsageOperators *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedUsageOperators *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(std430, binding = 0) buffer Buffer0 {" NL "  readonly int g_i0;" NL "  int g_o0;" NL "};" NL
			   "layout(std430, binding = 1) buffer Buffer1 {" NL "  int i0;" NL "} g_buffer1;" NL
			   "uniform int g_values[] = int[](1, 2, 3, 4, 5, 6);" NL "void main() {" NL "  g_o0 += g_i0;" NL
			   "  g_o0 <<= 1;" NL "  g_o0 = g_i0 > g_o0 ? g_i0 : g_o0;" NL "  g_o0 *= g_i0;" NL
			   "  g_o0 = --g_o0 + g_values[g_i0];" NL "  g_o0++;" NL "  ++g_o0;" NL "  g_buffer1.i0 = 0xff2f;" NL
			   "  g_o0 &= g_buffer1.i0;" NL "}";

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenVertexArrays(1, &m_vertex_array);
		glGenBuffers(2, m_storage_buffer);

		/* Buffer0 */
		{
			int data[4] = { 3, 5 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* Buffer1 */
		{
			int data[1] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* Buffer0 */
		{
			const int ref_data[2] = { 3, 37 };
			int		  data[4];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer0] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}
		/* Buffer0 */
		{
			const int ref_data[1] = { 0xff2f };
			int		  data[1];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			for (int i = 0; i < 1; ++i)
			{
				if (data[i] != ref_data[i])
				{
					Output("[Buffer1] Data at index %d is %d should be %d.\n", i, data[i], ref_data[i]);
					return ERROR;
				}
			}
		}

		return NO_ERROR;
	}